

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_257,_true,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined1 auVar9 [12];
  char cVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  NodeRef *pNVar16;
  ulong uVar17;
  ulong uVar18;
  ulong unaff_R15;
  byte bVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar53;
  vfloat4 a0;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    auVar44 = ZEXT464((uint)fVar1);
    auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar1) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar23 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar9 = ZEXT812(0) << 0x20;
      auVar26 = ZEXT816(0) << 0x40;
      auVar54._4_12_ = auVar9;
      auVar54._0_4_ = auVar23._0_4_;
      auVar21 = vrsqrt14ss_avx512f(auVar26,auVar54);
      fVar53 = auVar21._0_4_;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      pre.depth_scale = fVar53 * 1.5 - auVar23._0_4_ * 0.5 * fVar53 * fVar53 * fVar53;
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar53 = (ray->dir).field_0.m128[2];
      auVar55._0_4_ = aVar5.x * pre.depth_scale;
      auVar55._4_4_ = aVar5.y * pre.depth_scale;
      auVar55._8_4_ = aVar5.z * pre.depth_scale;
      auVar55._12_4_ = aVar5.field_3.w * pre.depth_scale;
      auVar21 = vshufpd_avx(auVar55,auVar55,1);
      auVar23 = vmovshdup_avx(auVar55);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar60._0_4_ = auVar23._0_4_ ^ 0x80000000;
      auVar23 = vunpckhps_avx(auVar55,auVar26);
      auVar60._4_12_ = auVar9;
      auVar25 = vshufps_avx(auVar23,auVar60,0x41);
      auVar58._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
      auVar58._8_8_ = auVar62._8_8_ ^ auVar21._8_8_;
      auVar22 = vinsertps_avx(auVar58,auVar55,0x2a);
      auVar23 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
      uVar8 = vcmpps_avx512vl(auVar21,auVar23,1);
      auVar23 = vpmovm2d_avx512vl(uVar8);
      auVar63._0_4_ = auVar23._0_4_;
      auVar63._4_4_ = auVar63._0_4_;
      auVar63._8_4_ = auVar63._0_4_;
      auVar63._12_4_ = auVar63._0_4_;
      uVar20 = vpmovd2m_avx512vl(auVar63);
      auVar23 = vpcmpeqd_avx(auVar63,auVar63);
      auVar21._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar23._4_4_;
      auVar21._0_4_ = (uint)((byte)uVar20 & 1) * auVar23._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar23._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar23._12_4_;
      auVar23 = vblendvps_avx(auVar22,auVar25,auVar21);
      auVar21 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar64._4_12_ = auVar9;
      auVar64._0_4_ = auVar21._0_4_;
      auVar22 = vrsqrt14ss_avx512f(auVar26,auVar64);
      fVar61 = auVar22._0_4_;
      fVar61 = fVar61 * 1.5 - auVar21._0_4_ * 0.5 * fVar61 * fVar61 * fVar61;
      auVar59._0_4_ = fVar61 * auVar23._0_4_;
      auVar59._4_4_ = fVar61 * auVar23._4_4_;
      auVar59._8_4_ = fVar61 * auVar23._8_4_;
      auVar59._12_4_ = fVar61 * auVar23._12_4_;
      auVar23 = vshufps_avx(auVar59,auVar59,0xc9);
      auVar21 = vshufps_avx(auVar55,auVar55,0xc9);
      auVar65._0_4_ = auVar21._0_4_ * auVar59._0_4_;
      auVar65._4_4_ = auVar21._4_4_ * auVar59._4_4_;
      auVar65._8_4_ = auVar21._8_4_ * auVar59._8_4_;
      auVar65._12_4_ = auVar21._12_4_ * auVar59._12_4_;
      auVar23 = vfmsub231ps_fma(auVar65,auVar55,auVar23);
      auVar21 = vshufps_avx(auVar23,auVar23,0xc9);
      auVar23 = vdpps_avx(auVar21,auVar21,0x7f);
      auVar66._4_12_ = auVar9;
      auVar66._0_4_ = auVar23._0_4_;
      auVar22 = vrsqrt14ss_avx512f(auVar26,auVar66);
      fVar61 = auVar22._0_4_;
      fVar61 = fVar61 * 1.5 - auVar23._0_4_ * 0.5 * fVar61 * fVar61 * fVar61;
      auVar57._0_4_ = auVar21._0_4_ * fVar61;
      auVar57._4_4_ = auVar21._4_4_ * fVar61;
      auVar57._8_4_ = auVar21._8_4_ * fVar61;
      auVar57._12_4_ = auVar21._12_4_ * fVar61;
      auVar50._0_4_ = pre.depth_scale * auVar55._0_4_;
      auVar50._4_4_ = pre.depth_scale * auVar55._4_4_;
      auVar50._8_4_ = pre.depth_scale * auVar55._8_4_;
      auVar50._12_4_ = pre.depth_scale * auVar55._12_4_;
      auVar22 = vunpcklps_avx(auVar59,auVar50);
      auVar23 = vunpckhps_avx(auVar59,auVar50);
      auVar25 = vunpcklps_avx(auVar57,auVar26);
      auVar21 = vunpckhps_avx(auVar57,auVar26);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar23,auVar21);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar22,auVar25);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar22,auVar25);
      pNVar16 = stack + 1;
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar5,auVar23);
      auVar22._8_4_ = 0x219392ef;
      auVar22._0_8_ = 0x219392ef219392ef;
      auVar22._12_4_ = 0x219392ef;
      uVar20 = vcmpps_avx512vl(auVar23,auVar22,1);
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = &DAT_3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar23 = vdivps_avx(auVar51,(undefined1  [16])aVar5);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar6 = (bool)((byte)uVar20 & 1);
      auVar24._0_4_ = (uint)bVar6 * auVar22._0_4_ | (uint)!bVar6 * auVar23._0_4_;
      bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar23._4_4_;
      bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar23._8_4_;
      bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar23._12_4_;
      auVar25._8_4_ = 0x3f7ffffa;
      auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar25._12_4_ = 0x3f7ffffa;
      auVar25 = vmulps_avx512vl(auVar24,auVar25);
      auVar26._8_4_ = 0x3f800003;
      auVar26._0_8_ = 0x3f8000033f800003;
      auVar26._12_4_ = 0x3f800003;
      auVar26 = vmulps_avx512vl(auVar24,auVar26);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar70._4_4_ = uVar4;
      auVar70._0_4_ = uVar4;
      auVar70._8_4_ = uVar4;
      auVar70._12_4_ = uVar4;
      auVar70._16_4_ = uVar4;
      auVar70._20_4_ = uVar4;
      auVar70._24_4_ = uVar4;
      auVar70._28_4_ = uVar4;
      auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar29 = vbroadcastss_avx512vl(auVar25);
      auVar23 = vmovshdup_avx(auVar25);
      auVar30 = vbroadcastsd_avx512vl(auVar23);
      auVar22 = vshufpd_avx(auVar25,auVar25,1);
      auVar34._8_4_ = 2;
      auVar34._0_8_ = 0x200000002;
      auVar34._12_4_ = 2;
      auVar34._16_4_ = 2;
      auVar34._20_4_ = 2;
      auVar34._24_4_ = 2;
      auVar34._28_4_ = 2;
      auVar31 = vpermps_avx512vl(auVar34,ZEXT1632(auVar25));
      auVar32 = vbroadcastss_avx512vl(auVar26);
      auVar33._8_4_ = 1;
      auVar33._0_8_ = 0x100000001;
      auVar33._12_4_ = 1;
      auVar33._16_4_ = 1;
      auVar33._20_4_ = 1;
      auVar33._24_4_ = 1;
      auVar33._28_4_ = 1;
      auVar33 = vpermps_avx512vl(auVar33,ZEXT1632(auVar26));
      auVar34 = vpermps_avx512vl(auVar34,ZEXT1632(auVar26));
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) * 0x20;
      uVar18 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar17 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      auVar35 = vbroadcastss_avx512vl(auVar21);
      auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
      do {
        if (pNVar16 == stack) {
          return;
        }
        uVar13 = pNVar16[-1].ptr;
        pNVar16 = pNVar16 + -1;
        do {
          if ((uVar13 & 0xf) == 0) {
            auVar37 = vsubps_avx(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar20),auVar70);
            auVar37 = vmulps_avx512vl(auVar29,auVar37);
            auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar18),auVar27);
            auVar38 = vmulps_avx512vl(auVar30,auVar38);
            auVar37 = vmaxps_avx(auVar37,auVar38);
            auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar17),auVar28);
            auVar39 = vmulps_avx512vl(auVar31,auVar38);
            auVar38 = vsubps_avx(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar20 ^ 0x20)),auVar70);
            auVar38 = vmulps_avx512vl(auVar32,auVar38);
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar18 ^ 0x20)),
                                      auVar27);
            auVar40 = vmulps_avx512vl(auVar33,auVar40);
            auVar38 = vminps_avx(auVar38,auVar40);
            auVar40 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar13 + 0x40 + (uVar17 ^ 0x20)),
                                      auVar28);
            auVar40 = vmulps_avx512vl(auVar34,auVar40);
            auVar39 = vmaxps_avx512vl(auVar39,auVar35);
            auVar37 = vmaxps_avx(auVar37,auVar39);
            auVar39 = vminps_avx512vl(auVar40,auVar36);
            auVar38 = vminps_avx(auVar38,auVar39);
            uVar8 = vcmpps_avx512vl(auVar37,auVar38,2);
            bVar19 = (byte)uVar8;
LAB_007204eb:
            auVar46 = ZEXT3264(auVar38);
            auVar44 = ZEXT3264(auVar37);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar19);
            bVar6 = true;
          }
          else {
            if ((int)(uVar13 & 0xf) == 2) {
              uVar11 = uVar13 & 0xfffffffffffffff0;
              auVar37 = *(undefined1 (*) [32])(uVar11 + 0x100);
              auVar45._0_4_ = fVar53 * auVar37._0_4_;
              auVar45._4_4_ = fVar53 * auVar37._4_4_;
              auVar45._8_4_ = fVar53 * auVar37._8_4_;
              auVar45._12_4_ = fVar53 * auVar37._12_4_;
              auVar45._16_4_ = fVar53 * auVar37._16_4_;
              auVar45._20_4_ = fVar53 * auVar37._20_4_;
              auVar45._28_36_ = auVar44._28_36_;
              auVar45._24_4_ = fVar53 * auVar37._24_4_;
              auVar38 = *(undefined1 (*) [32])(uVar11 + 0x120);
              auVar47._0_4_ = fVar53 * auVar38._0_4_;
              auVar47._4_4_ = fVar53 * auVar38._4_4_;
              auVar47._8_4_ = fVar53 * auVar38._8_4_;
              auVar47._12_4_ = fVar53 * auVar38._12_4_;
              auVar47._16_4_ = fVar53 * auVar38._16_4_;
              auVar47._20_4_ = fVar53 * auVar38._20_4_;
              auVar47._28_36_ = auVar46._28_36_;
              auVar47._24_4_ = fVar53 * auVar38._24_4_;
              auVar39 = *(undefined1 (*) [32])(uVar11 + 0x140);
              auVar40._4_4_ = fVar53 * auVar39._4_4_;
              auVar40._0_4_ = fVar53 * auVar39._0_4_;
              auVar40._8_4_ = fVar53 * auVar39._8_4_;
              auVar40._12_4_ = fVar53 * auVar39._12_4_;
              auVar40._16_4_ = fVar53 * auVar39._16_4_;
              auVar40._20_4_ = fVar53 * auVar39._20_4_;
              auVar40._24_4_ = fVar53 * auVar39._24_4_;
              auVar40._28_4_ = fVar53;
              auVar7._4_4_ = uVar3;
              auVar7._0_4_ = uVar3;
              auVar7._8_4_ = uVar3;
              auVar7._12_4_ = uVar3;
              auVar7._16_4_ = uVar3;
              auVar7._20_4_ = uVar3;
              auVar7._24_4_ = uVar3;
              auVar7._28_4_ = uVar3;
              auVar23 = vfmadd231ps_fma(auVar45._0_32_,auVar7,*(undefined1 (*) [32])(uVar11 + 0xa0))
              ;
              auVar21 = vfmadd231ps_fma(auVar47._0_32_,auVar7,*(undefined1 (*) [32])(uVar11 + 0xc0))
              ;
              auVar22 = vfmadd231ps_fma(auVar40,auVar7,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              auVar48._16_4_ = uVar2;
              auVar48._20_4_ = uVar2;
              auVar48._24_4_ = uVar2;
              auVar48._28_4_ = uVar2;
              auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x40));
              auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x60));
              auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x80));
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar67._16_4_ = 0x7fffffff;
              auVar67._20_4_ = 0x7fffffff;
              auVar67._24_4_ = 0x7fffffff;
              auVar67._28_4_ = 0x7fffffff;
              auVar40 = vandps_avx(auVar67,ZEXT1632(auVar23));
              auVar69._8_4_ = 0x219392ef;
              auVar69._0_8_ = 0x219392ef219392ef;
              auVar69._12_4_ = 0x219392ef;
              auVar69._16_4_ = 0x219392ef;
              auVar69._20_4_ = 0x219392ef;
              auVar69._24_4_ = 0x219392ef;
              auVar69._28_4_ = 0x219392ef;
              uVar12 = vcmpps_avx512vl(auVar40,auVar69,1);
              bVar6 = (bool)((byte)uVar12 & 1);
              auVar41._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar23._0_4_;
              bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar23._4_4_;
              bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar23._8_4_;
              bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar23._12_4_;
              auVar41._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * 0x219392ef;
              auVar41._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * 0x219392ef;
              auVar41._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * 0x219392ef;
              auVar41._28_4_ = (uint)(byte)(uVar12 >> 7) * 0x219392ef;
              auVar40 = vandps_avx(auVar67,ZEXT1632(auVar21));
              uVar12 = vcmpps_avx512vl(auVar40,auVar69,1);
              bVar6 = (bool)((byte)uVar12 & 1);
              auVar42._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._0_4_;
              bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar42._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._4_4_;
              bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar42._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._8_4_;
              bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar42._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._12_4_;
              auVar42._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * 0x219392ef;
              auVar42._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * 0x219392ef;
              auVar42._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * 0x219392ef;
              auVar42._28_4_ = (uint)(byte)(uVar12 >> 7) * 0x219392ef;
              auVar40 = vandps_avx(auVar67,ZEXT1632(auVar22));
              uVar12 = vcmpps_avx512vl(auVar40,auVar69,1);
              bVar6 = (bool)((byte)uVar12 & 1);
              auVar43._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar22._0_4_;
              bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar43._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar22._4_4_;
              bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar43._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar22._8_4_;
              bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar43._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar22._12_4_;
              auVar43._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * 0x219392ef;
              auVar43._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * 0x219392ef;
              auVar43._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * 0x219392ef;
              auVar43._28_4_ = (uint)(byte)(uVar12 >> 7) * 0x219392ef;
              auVar40 = vrcp14ps_avx512vl(auVar41);
              auVar68._8_4_ = 0x3f800000;
              auVar68._0_8_ = &DAT_3f8000003f800000;
              auVar68._12_4_ = 0x3f800000;
              auVar68._16_4_ = 0x3f800000;
              auVar68._20_4_ = 0x3f800000;
              auVar68._24_4_ = 0x3f800000;
              auVar68._28_4_ = 0x3f800000;
              auVar23 = vfnmadd213ps_fma(auVar41,auVar40,auVar68);
              auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar40,auVar40);
              auVar40 = vrcp14ps_avx512vl(auVar42);
              auVar21 = vfnmadd213ps_fma(auVar42,auVar40,auVar68);
              auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar40,auVar40);
              auVar40 = vrcp14ps_avx512vl(auVar43);
              auVar22 = vfnmadd213ps_fma(auVar43,auVar40,auVar68);
              auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar40,auVar40);
              auVar37 = vfmadd213ps_avx512vl(auVar37,auVar28,*(undefined1 (*) [32])(uVar11 + 0x160))
              ;
              auVar38 = vfmadd213ps_avx512vl(auVar38,auVar28,*(undefined1 (*) [32])(uVar11 + 0x180))
              ;
              auVar39 = vfmadd213ps_avx512vl(auVar39,auVar28,*(undefined1 (*) [32])(uVar11 + 0x1a0))
              ;
              auVar37 = vfmadd231ps_avx512vl(auVar37,auVar27,*(undefined1 (*) [32])(uVar11 + 0xa0));
              auVar38 = vfmadd231ps_avx512vl(auVar38,auVar27,*(undefined1 (*) [32])(uVar11 + 0xc0));
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar27,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar25 = vfmadd231ps_fma(auVar37,auVar70,*(undefined1 (*) [32])(uVar11 + 0x40));
              auVar56._0_4_ = -auVar23._0_4_ * auVar25._0_4_;
              auVar56._4_4_ = -auVar23._4_4_ * auVar25._4_4_;
              auVar56._8_4_ = -auVar23._8_4_ * auVar25._8_4_;
              auVar56._12_4_ = -auVar23._12_4_ * auVar25._12_4_;
              auVar56._16_4_ = 0x80000000;
              auVar56._20_4_ = 0x80000000;
              auVar56._24_4_ = 0x80000000;
              auVar56._28_4_ = 0;
              auVar25 = vfmadd231ps_fma(auVar38,auVar70,*(undefined1 (*) [32])(uVar11 + 0x60));
              auVar52._0_4_ = -auVar21._0_4_ * auVar25._0_4_;
              auVar52._4_4_ = -auVar21._4_4_ * auVar25._4_4_;
              auVar52._8_4_ = -auVar21._8_4_ * auVar25._8_4_;
              auVar52._12_4_ = -auVar21._12_4_ * auVar25._12_4_;
              auVar52._16_4_ = 0x80000000;
              auVar52._20_4_ = 0x80000000;
              auVar52._24_4_ = 0x80000000;
              auVar52._28_4_ = 0;
              auVar25 = vfmadd231ps_fma(auVar39,auVar70,*(undefined1 (*) [32])(uVar11 + 0x80));
              auVar49._0_4_ = -auVar22._0_4_ * auVar25._0_4_;
              auVar49._4_4_ = -auVar22._4_4_ * auVar25._4_4_;
              auVar49._8_4_ = -auVar22._8_4_ * auVar25._8_4_;
              auVar49._12_4_ = -auVar22._12_4_ * auVar25._12_4_;
              auVar49._16_4_ = 0x80000000;
              auVar49._20_4_ = 0x80000000;
              auVar49._24_4_ = 0x80000000;
              auVar49._28_4_ = 0;
              auVar39 = ZEXT1632(CONCAT412(auVar23._12_4_ + auVar56._12_4_,
                                           CONCAT48(auVar23._8_4_ + auVar56._8_4_,
                                                    CONCAT44(auVar23._4_4_ + auVar56._4_4_,
                                                             auVar23._0_4_ + auVar56._0_4_))));
              auVar40 = ZEXT1632(CONCAT412(auVar21._12_4_ + auVar52._12_4_,
                                           CONCAT48(auVar21._8_4_ + auVar52._8_4_,
                                                    CONCAT44(auVar21._4_4_ + auVar52._4_4_,
                                                             auVar21._0_4_ + auVar52._0_4_))));
              auVar48 = ZEXT1632(CONCAT412(auVar22._12_4_ + auVar49._12_4_,
                                           CONCAT48(auVar22._8_4_ + auVar49._8_4_,
                                                    CONCAT44(auVar22._4_4_ + auVar49._4_4_,
                                                             auVar22._0_4_ + auVar49._0_4_))));
              auVar7 = vpminsd_avx2(auVar56,auVar39);
              auVar37 = vpminsd_avx2(auVar52,auVar40);
              auVar38 = vpminsd_avx2(auVar49,auVar48);
              auVar37 = vmaxps_avx(auVar37,auVar38);
              auVar39 = vpmaxsd_avx2(auVar56,auVar39);
              auVar38 = vpmaxsd_avx2(auVar52,auVar40);
              auVar40 = vpmaxsd_avx2(auVar49,auVar48);
              auVar38 = vminps_avx(auVar38,auVar40);
              auVar40 = vmaxps_avx512vl(auVar35,auVar7);
              auVar37 = vmaxps_avx(auVar40,auVar37);
              auVar39 = vminps_avx512vl(auVar36,auVar39);
              auVar39 = vminps_avx(auVar39,auVar38);
              auVar38._8_4_ = 0x3f7ffffa;
              auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar38._12_4_ = 0x3f7ffffa;
              auVar38._16_4_ = 0x3f7ffffa;
              auVar38._20_4_ = 0x3f7ffffa;
              auVar38._24_4_ = 0x3f7ffffa;
              auVar38._28_4_ = 0x3f7ffffa;
              auVar38 = vmulps_avx512vl(auVar37,auVar38);
              auVar37._8_4_ = 0x3f800003;
              auVar37._0_8_ = 0x3f8000033f800003;
              auVar37._12_4_ = 0x3f800003;
              auVar37._16_4_ = 0x3f800003;
              auVar37._20_4_ = 0x3f800003;
              auVar37._24_4_ = 0x3f800003;
              auVar37._28_4_ = 0x3f800003;
              auVar37 = vmulps_avx512vl(auVar39,auVar37);
              uVar8 = vcmpps_avx512vl(auVar38,auVar37,2);
              bVar19 = (byte)uVar8;
              goto LAB_007204eb;
            }
            bVar6 = false;
          }
          if (bVar6) {
            if (unaff_R15 == 0) {
              iVar14 = 4;
            }
            else {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              lVar15 = 0;
              for (uVar13 = unaff_R15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
              {
                lVar15 = lVar15 + 1;
              }
              iVar14 = 0;
              for (uVar11 = unaff_R15 - 1 & unaff_R15; uVar13 = *(ulong *)(uVar12 + lVar15 * 8),
                  uVar11 != 0; uVar11 = uVar11 - 1 & uVar11) {
                pNVar16->ptr = uVar13;
                pNVar16 = pNVar16 + 1;
                lVar15 = 0;
                for (uVar13 = uVar11; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
              }
            }
          }
          else {
            iVar14 = 6;
          }
        } while (iVar14 == 0);
        if (iVar14 == 6) {
          cVar10 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar13 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          auVar46._8_56_ = extraout_var_00;
          auVar46._0_8_ = extraout_XMM1_Qa;
          auVar44._8_56_ = extraout_var;
          auVar44._0_8_ = extraout_XMM0_Qa;
          iVar14 = 0;
          if (cVar10 != '\0') {
            ray->tfar = -INFINITY;
            iVar14 = 3;
          }
        }
      } while (iVar14 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }